

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O3

void __thiscall
kratos::EventVisitor::add_info(EventVisitor *this,shared_ptr<kratos::EventTracingStmt> *stmt)

{
  size_type *psVar1;
  element_type *peVar2;
  int iVar3;
  Stmt *s;
  undefined4 extraout_var;
  long *plVar4;
  char cVar5;
  undefined1 local_c0 [8];
  EventInfo i;
  
  iVar3 = (*(((stmt->super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_AuxiliaryStmt).super_Stmt.super_IRNode._vptr_IRNode[4])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  cVar5 = '\x01';
  while( true ) {
    if ((plVar4 == (long *)0x0) || ((int)plVar4[9] != 2)) goto LAB_0020a1b4;
    if (((int)plVar4[0xf] == 4) && ((int)plVar4[0x1b] == 1)) break;
    plVar4 = (long *)(**(code **)(*plVar4 + 0x20))(plVar4);
  }
  cVar5 = '\0';
LAB_0020a1b4:
  local_c0 = (undefined1  [8])&i.name._M_string_length;
  i.name._M_dataplus._M_p = (pointer)0x0;
  i.name._M_string_length._0_1_ = 0;
  psVar1 = &i.transaction._M_string_length;
  i.transaction._M_dataplus._M_p = (pointer)0x0;
  i.transaction._M_string_length._0_1_ = 0;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&i.fields;
  i.fields._M_t._M_impl._0_4_ = 0;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  i.stmt.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  i.name.field_2._8_8_ = psVar1;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_assign((string *)local_c0);
  std::__cxx11::string::_M_assign((string *)(i.name.field_2._M_local_buf + 8));
  peVar2 = (stmt->super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  i._64_8_ = peVar2->action_type_;
  i.transaction.field_2._M_local_buf[8] = cVar5;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)&i.type,&(peVar2->event_fields_)._M_t);
  i.fields._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)(stmt->super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&i.stmt,
             &(stmt->super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  std::vector<kratos::EventInfo,std::allocator<kratos::EventInfo>>::emplace_back<kratos::EventInfo&>
            ((vector<kratos::EventInfo,std::allocator<kratos::EventInfo>> *)&this->info,
             (EventInfo *)local_c0);
  if (i.stmt.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               i.stmt.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)&i.type);
  if ((size_type *)i.name.field_2._8_8_ != psVar1) {
    operator_delete((void *)i.name.field_2._8_8_,
                    CONCAT71(i.transaction._M_string_length._1_7_,
                             (undefined1)i.transaction._M_string_length) + 1);
  }
  if (local_c0 != (undefined1  [8])&i.name._M_string_length) {
    operator_delete((void *)local_c0,
                    CONCAT71(i.name._M_string_length._1_7_,(undefined1)i.name._M_string_length) + 1)
    ;
  }
  return;
}

Assistant:

void add_info(const std::shared_ptr<EventTracingStmt> &stmt) {
        bool combinational = true;
        auto *p = stmt->parent();

        while (p && p->ir_node_kind() == IRNodeKind::StmtKind) {
            auto *s = reinterpret_cast<Stmt *>(p);
            if (s->type() == StatementType::Block) {
                auto *b = reinterpret_cast<StmtBlock *>(s);
                if (b->block_type() == StatementBlockType::Sequential) {
                    combinational = false;
                    break;
                }
            }

            p = s->parent();
        }

        EventInfo i;
        i.name = stmt->event_name();
        i.transaction = stmt->transaction();
        i.combinational = combinational;
        i.type = stmt->action_type();
        i.fields = stmt->event_fields();
        i.stmt = stmt;

        info.emplace_back(i);
    }